

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_draw.cpp
# Opt level: O3

void __thiscall
ImDrawList::AddRectFilledMultiColor
          (ImDrawList *this,ImVec2 *p_min,ImVec2 *p_max,ImU32 col_upr_left,ImU32 col_upr_right,
          ImU32 col_bot_right,ImU32 col_bot_left)

{
  uint uVar1;
  float fVar2;
  ImVec2 IVar3;
  uint *puVar4;
  ImDrawVert *pIVar5;
  
  if (0xffffff < (col_upr_right | col_upr_left | col_bot_right | col_bot_left)) {
    IVar3 = this->_Data->TexUvWhitePixel;
    PrimReserve(this,6,4);
    uVar1 = this->_VtxCurrentIdx;
    puVar4 = this->_IdxWritePtr;
    *puVar4 = uVar1;
    puVar4[1] = uVar1 + 1;
    puVar4[2] = this->_VtxCurrentIdx + 2;
    uVar1 = this->_VtxCurrentIdx;
    puVar4[3] = uVar1;
    puVar4[4] = uVar1 + 2;
    puVar4[5] = this->_VtxCurrentIdx + 3;
    this->_IdxWritePtr = puVar4 + 6;
    this->_VtxWritePtr->pos = *p_min;
    this->_VtxWritePtr->uv = IVar3;
    pIVar5 = this->_VtxWritePtr;
    pIVar5->col = col_upr_left;
    this->_VtxWritePtr = pIVar5 + 1;
    this->_VtxCurrentIdx = this->_VtxCurrentIdx + 1;
    fVar2 = p_min->y;
    pIVar5[1].pos.x = p_max->x;
    pIVar5[1].pos.y = fVar2;
    this->_VtxWritePtr->uv = IVar3;
    pIVar5 = this->_VtxWritePtr;
    pIVar5->col = col_upr_right;
    this->_VtxWritePtr = pIVar5 + 1;
    this->_VtxCurrentIdx = this->_VtxCurrentIdx + 1;
    pIVar5[1].pos = *p_max;
    this->_VtxWritePtr->uv = IVar3;
    pIVar5 = this->_VtxWritePtr;
    pIVar5->col = col_bot_right;
    this->_VtxWritePtr = pIVar5 + 1;
    this->_VtxCurrentIdx = this->_VtxCurrentIdx + 1;
    fVar2 = p_max->y;
    pIVar5[1].pos.x = p_min->x;
    pIVar5[1].pos.y = fVar2;
    this->_VtxWritePtr->uv = IVar3;
    pIVar5 = this->_VtxWritePtr;
    pIVar5->col = col_bot_left;
    this->_VtxWritePtr = pIVar5 + 1;
    this->_VtxCurrentIdx = this->_VtxCurrentIdx + 1;
  }
  return;
}

Assistant:

void ImDrawList::AddRectFilledMultiColor(const ImVec2& p_min, const ImVec2& p_max, ImU32 col_upr_left, ImU32 col_upr_right, ImU32 col_bot_right, ImU32 col_bot_left)
{
    if (((col_upr_left | col_upr_right | col_bot_right | col_bot_left) & IM_COL32_A_MASK) == 0)
        return;

    const ImVec2 uv = _Data->TexUvWhitePixel;
    PrimReserve(6, 4);
    PrimWriteIdx((ImDrawIdx)(_VtxCurrentIdx)); PrimWriteIdx((ImDrawIdx)(_VtxCurrentIdx+1)); PrimWriteIdx((ImDrawIdx)(_VtxCurrentIdx+2));
    PrimWriteIdx((ImDrawIdx)(_VtxCurrentIdx)); PrimWriteIdx((ImDrawIdx)(_VtxCurrentIdx+2)); PrimWriteIdx((ImDrawIdx)(_VtxCurrentIdx+3));
    PrimWriteVtx(p_min, uv, col_upr_left);
    PrimWriteVtx(ImVec2(p_max.x, p_min.y), uv, col_upr_right);
    PrimWriteVtx(p_max, uv, col_bot_right);
    PrimWriteVtx(ImVec2(p_min.x, p_max.y), uv, col_bot_left);
}